

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestNextFreeFidForAnEmptyDataDictionaryIsZero_Test::TestBody
          (ExtendedDataDictionaryTest_TestNextFreeFidForAnEmptyDataDictionaryIsZero_Test *this)

{
  char *message;
  AssertHelper local_90;
  AssertionResult gtest_ar;
  int local_74;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 *local_20;
  undefined8 *local_18;
  undefined8 local_10;
  
  local_90.data_._0_4_ = 0;
  local_50 = &uStack_60;
  local_70.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::tools::ByteBuffer::WriteShort;
  local_58 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_20 = &local_30;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0;
  uStack_28 = 0;
  local_10 = 0;
  local_48 = local_50;
  local_18 = local_20;
  local_74 = bidfx_public_api::price::pixie::ExtendableDataDictionary::NextFreeFid();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","ExtendableDataDictionary().NextFreeFid()",(int *)&local_90,
             &local_74);
  ExtendableDataDictionary::~ExtendableDataDictionary((ExtendableDataDictionary *)&local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0xab,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(ExtendedDataDictionaryTest, TestNextFreeFidForAnEmptyDataDictionaryIsZero)
{
    ASSERT_EQ(0, ExtendableDataDictionary().NextFreeFid());
}